

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

int json_value_equals(JSON_Value *a,JSON_Value *b)

{
  int iVar1;
  size_t sVar2;
  JSON_Value *pJVar3;
  JSON_Value *pJVar4;
  JSON_Value_Value *pJVar5;
  int iVar6;
  JSON_Object *pJVar7;
  unsigned_long *puVar8;
  JSON_Object *pJVar9;
  ulong uVar10;
  char *name;
  unsigned_long *puVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  size_t local_38;
  
  iVar6 = -1;
  iVar1 = -1;
  if (a != (JSON_Value *)0x0) {
    iVar1 = a->type;
  }
  if (b != (JSON_Value *)0x0) {
    iVar6 = b->type;
  }
  if (iVar1 != iVar6) goto LAB_00177928;
  switch(iVar1) {
  case 2:
    if (a == (JSON_Value *)0x0) {
      pJVar5 = (JSON_Value_Value *)0x0;
    }
    else {
      pJVar5 = (JSON_Value_Value *)0x0;
      if (a->type == 2) {
        pJVar5 = &a->value;
      }
    }
    if (b != (JSON_Value *)0x0) {
      bVar12 = false;
      if ((pJVar5 == (JSON_Value_Value *)0x0) || (b->type != 2)) goto LAB_0017792a;
      if ((pJVar5->string).length == (b->value).string.length) {
        iVar1 = bcmp((pJVar5->string).chars,(b->value).string.chars,(pJVar5->string).length);
        bVar12 = iVar1 == 0;
        goto LAB_0017792a;
      }
    }
    break;
  case 3:
    dVar13 = 0.0;
    dVar14 = 0.0;
    if ((a != (JSON_Value *)0x0) && (a->type == 3)) {
      dVar14 = (a->value).number;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 3)) {
      dVar13 = (b->value).number;
    }
    bVar12 = ABS(dVar14 - dVar13) < 1e-06;
    goto LAB_0017792a;
  case 4:
    if ((a == (JSON_Value *)0x0) || (a->type != 4)) {
      pJVar7 = (JSON_Object *)0x0;
    }
    else {
      pJVar7 = (a->value).object;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 4)) {
      pJVar9 = (JSON_Object *)0x0;
    }
    else {
      pJVar9 = (b->value).object;
    }
    if (pJVar7 == (JSON_Object *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = pJVar7->count;
    }
    if (pJVar9 == (JSON_Object *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = pJVar9->count;
    }
    if (local_38 == sVar2) {
      uVar10 = 0;
      do {
        bVar12 = local_38 == uVar10;
        if (bVar12) break;
        if ((pJVar7 == (JSON_Object *)0x0) || (pJVar7->count <= uVar10)) {
          name = (char *)0x0;
        }
        else {
          name = pJVar7->names[uVar10];
        }
        pJVar3 = json_object_get_value(pJVar7,name);
        pJVar4 = json_object_get_value(pJVar9,name);
        iVar1 = json_value_equals(pJVar3,pJVar4);
        uVar10 = uVar10 + 1;
      } while (iVar1 != 0);
      goto LAB_0017792a;
    }
    break;
  case 5:
    if ((a == (JSON_Value *)0x0) || (a->type != 5)) {
      pJVar7 = (JSON_Object *)0x0;
    }
    else {
      pJVar7 = (a->value).object;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 5)) {
      pJVar9 = (JSON_Object *)0x0;
    }
    else {
      pJVar9 = (b->value).object;
    }
    if (pJVar7 == (JSON_Object *)0x0) {
      puVar11 = (unsigned_long *)0x0;
    }
    else {
      puVar11 = pJVar7->hashes;
    }
    if (pJVar9 == (JSON_Object *)0x0) {
      puVar8 = (unsigned_long *)0x0;
    }
    else {
      puVar8 = pJVar9->hashes;
    }
    if (puVar11 == puVar8) {
      puVar8 = (unsigned_long *)0x0;
      do {
        bVar12 = puVar11 == puVar8;
        if (bVar12) break;
        if ((pJVar7 == (JSON_Object *)0x0) || (pJVar7->hashes <= puVar8)) {
          pJVar3 = (JSON_Value *)0x0;
        }
        else {
          pJVar3 = (JSON_Value *)pJVar7->cells[(long)puVar8];
        }
        if ((pJVar9 == (JSON_Object *)0x0) || (pJVar9->hashes <= puVar8)) {
          pJVar4 = (JSON_Value *)0x0;
        }
        else {
          pJVar4 = (JSON_Value *)pJVar9->cells[(long)puVar8];
        }
        iVar1 = json_value_equals(pJVar3,pJVar4);
        puVar8 = (unsigned_long *)((long)puVar8 + 1);
      } while (iVar1 != 0);
      goto LAB_0017792a;
    }
    break;
  case 6:
    iVar6 = -1;
    iVar1 = iVar6;
    if ((a != (JSON_Value *)0x0) && (a->type == 6)) {
      iVar1 = (a->value).boolean;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 6)) {
      iVar6 = (b->value).boolean;
    }
    bVar12 = iVar1 == iVar6;
    goto LAB_0017792a;
  default:
    bVar12 = true;
    goto LAB_0017792a;
  }
LAB_00177928:
  bVar12 = false;
LAB_0017792a:
  return (int)bVar12;
}

Assistant:

int json_value_equals(const JSON_Value *a, const JSON_Value *b) {
    JSON_Object *a_object = NULL, *b_object = NULL;
    JSON_Array *a_array = NULL, *b_array = NULL;
    const JSON_String *a_string = NULL, *b_string = NULL;
    const char *key = NULL;
    size_t a_count = 0, b_count = 0, i = 0;
    JSON_Value_Type a_type, b_type;
    a_type = json_value_get_type(a);
    b_type = json_value_get_type(b);
    if (a_type != b_type) {
        return PARSON_FALSE;
    }
    switch (a_type) {
        case JSONArray:
            a_array = json_value_get_array(a);
            b_array = json_value_get_array(b);
            a_count = json_array_get_count(a_array);
            b_count = json_array_get_count(b_array);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                if (!json_value_equals(json_array_get_value(a_array, i),
                                       json_array_get_value(b_array, i))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONObject:
            a_object = json_value_get_object(a);
            b_object = json_value_get_object(b);
            a_count = json_object_get_count(a_object);
            b_count = json_object_get_count(b_object);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                key = json_object_get_name(a_object, i);
                if (!json_value_equals(json_object_get_value(a_object, key),
                                       json_object_get_value(b_object, key))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONString:
            a_string = json_value_get_string_desc(a);
            b_string = json_value_get_string_desc(b);
            if (a_string == NULL || b_string == NULL) {
                return PARSON_FALSE; /* shouldn't happen */
            }
            return a_string->length == b_string->length &&
                   memcmp(a_string->chars, b_string->chars, a_string->length) == 0;
        case JSONBoolean:
            return json_value_get_boolean(a) == json_value_get_boolean(b);
        case JSONNumber:
            return fabs(json_value_get_number(a) - json_value_get_number(b)) < 0.000001; /* EPSILON */
        case JSONError:
            return PARSON_TRUE;
        case JSONNull:
            return PARSON_TRUE;
        default:
            return PARSON_TRUE;
    }
}